

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_TestShell::createTest
          (TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_TestShell *this)

{
  TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test *this_00;
  TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_TestShell *this_local;
  
  this_00 = (TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x237);
  TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test::
  TEST_SimpleString_copyInBufferWithSmallerBufferThanNeeded_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, copyInBufferWithSmallerBufferThanNeeded)
{
    SimpleString str("Hello");
    size_t bufferSize = str.size();
    char* buffer= (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRNCMP_EQUAL(str.asCharString(), buffer, (bufferSize-1));
    LONGS_EQUAL(0, buffer[bufferSize-1]);
    PlatformSpecificFree(buffer);
}